

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,double x1,
          double y1,double x2,double y2)

{
  int x1_00;
  int y1_00;
  int x2_00;
  int y2_00;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this_local;
  
  reset(this);
  x1_00 = ras_conv_int::upscale(x1);
  y1_00 = ras_conv_int::upscale(y1);
  x2_00 = ras_conv_int::upscale(x2);
  y2_00 = ras_conv_int::upscale(y2);
  rasterizer_sl_clip<agg::ras_conv_int>::clip_box(&this->m_clipper,x1_00,y1_00,x2_00,y2_00);
  return;
}

Assistant:

void rasterizer_scanline_aa<Clip>::clip_box(double x1, double y1, 
                                                double x2, double y2)
    {
        reset();
        m_clipper.clip_box(conv_type::upscale(x1), conv_type::upscale(y1), 
                           conv_type::upscale(x2), conv_type::upscale(y2));
    }